

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

_Bool utf32_isprint(uint32_t v)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  if (0x10 < (byte)(v >> 0x10)) {
    return false;
  }
  if ((0x1800eU >> (v >> 0x10 & 0x1f) & 1) != 0) goto LAB_001fa3f9;
  if ((v >> 0x10 & 0xff) != 0) {
    return false;
  }
  uVar1 = v >> 8 & 0xff;
  if (uVar1 < 0xfd) {
    if (uVar1 - 0xd8 < 8) {
      return false;
    }
    if (uVar1 != 0) goto LAB_001fa3f9;
    bVar2 = v < 0x20;
    bVar3 = v - 0x7f < 0x21;
  }
  else {
    if (uVar1 == 0xfd) {
      if (v - 0xfdd0 < 0x20) {
        return false;
      }
      goto LAB_001fa3f9;
    }
    if (uVar1 != 0xfe) {
      if ((uVar1 == 0xff) && (v - 0xfff9 < 3)) {
        return false;
      }
      goto LAB_001fa3f9;
    }
    bVar2 = (v & 0xfff0) == 0xfe00;
    bVar3 = v == 0xfeff;
  }
  if ((bool)(bVar3 | bVar2)) {
    return false;
  }
LAB_001fa3f9:
  return (~v & 0xfffe) != 0;
}

Assistant:

bool utf32_isprint(uint32_t v)
{
	/* Switch based on the plane (each plane has 2^16 code points). */
        switch ((v & 0xff0000) >> 16) {
        case 0:
                /* Is the basic multilingual plane.  Most things are here. */
                switch ((v & 0xff00) >> 8) {
                case 0:
                        /*
                         * C0 control characters, DEL, and C1 controls are
                         * not printable.
                         */
                        if (v <= 0x1f || (v >= 0x7f && v <= 0x9f)) {
                                return false;
                        }
                        break;

                case 0xd8:
                case 0xd9:
                case 0xda:
                case 0xdb:
                case 0xdc:
                case 0xdd:
                case 0xde:
                case 0xdf:
                        /* Used for surrogate pairs in UTF-16. */
                        return false;

                case 0xfd:
                        /*
                         * Part of the arabic presentation forms-a block is
                         * guaranteed to not be used for characters.
                         */
                        if (v >= 0xfdd0 && v <= 0xfdef) {
                                return false;
                        }
                        break;

                case 0xfe:
                        /*
                         * The variation selectors indicate how to present a
                         * preceding character.  Treat as not printable.
                         * Also exclude the byte-order mark, 0xfeff.
                         */
                        if ((v & 0xfff0) == 0xfe00 || v == 0xfeff) {
                                return false;
                        }
                        break;

                case 0xff:
                        /* Interlinear annotation marks are not printable. */
                        if (v >= 0xfff9 && v <= 0xfffb) {
                                return false;
                        }
                        break;

                default:
                        /* Do no special casing for the rest. */
                        break;
                }
                break;

        case 1:
                /* Is the supplemental multilingual plane. */
        case 2:
                /* Is the supplmental ideographic plane. */
        case 3:
                /* Is the tertiary ideographic plane. */
                /* Assume no no special casing for those planes. */
                break;

        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
        case 9:
        case 10:
        case 11:
        case 12:
        case 13:
                /*
                 * Those planes are currently unassigned.  Assume unprintable.
                 */
                return false;

        case 14:
                /*
                 * Is the supplemental special-purpose plane.  Used for tags
                 * to modify a preceding character or to indicate a variant
                 * form of an ideograph.  Assume all are unprintable.
                 */
                return false;

        case 15:
        case 16:
                /*
                 * These are private use planes.  Assume that no special
                 * cases are necessary.
                 */
                break;

        default:
                /* Is not a valid Unicode code point. */
                return false;
        }

        /*
         * Assume printable unless it is xxfffe or xxffff which are guaranteed
         * to not be characters (i.e. the code points in the basic multilingual
         * plane used as byte-order marks).
         */
        return ((v & 0xfffe) != 0xfffe);
}